

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_version_manager.cpp
# Opt level: O2

idx_t __thiscall
duckdb::RowVersionManager::GetSelVector
          (RowVersionManager *this,TransactionData transaction,idx_t vector_idx,
          SelectionVector *sel_vector,idx_t max_count)

{
  int iVar1;
  ChunkInfo *pCVar2;
  undefined4 extraout_var;
  optional_ptr<duckdb::ChunkInfo,_true> chunk_info;
  optional_ptr<duckdb::ChunkInfo,_true> local_28;
  
  ::std::mutex::lock(&this->version_lock);
  local_28 = GetChunkInfo(this,vector_idx);
  if (local_28.ptr != (ChunkInfo *)0x0) {
    pCVar2 = optional_ptr<duckdb::ChunkInfo,_true>::operator->(&local_28);
    iVar1 = (*pCVar2->_vptr_ChunkInfo[2])(pCVar2,sel_vector,max_count);
    max_count = CONCAT44(extraout_var,iVar1);
  }
  pthread_mutex_unlock((pthread_mutex_t *)this);
  return max_count;
}

Assistant:

idx_t RowVersionManager::GetSelVector(TransactionData transaction, idx_t vector_idx, SelectionVector &sel_vector,
                                      idx_t max_count) {
	lock_guard<mutex> l(version_lock);
	auto chunk_info = GetChunkInfo(vector_idx);
	if (!chunk_info) {
		return max_count;
	}
	return chunk_info->GetSelVector(transaction, sel_vector, max_count);
}